

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

void __thiscall Client::_parseLine(Client *this,string *line)

{
  ServerConnection *this_00;
  string data;
  string command;
  string local_88;
  string local_68;
  long *local_48 [2];
  long local_38 [2];
  
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88);
  if (*(line->_M_dataplus)._M_p == '\\') {
    std::__cxx11::string::substr((ulong)local_48,(ulong)line);
    std::__cxx11::string::operator=((string *)&local_68,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    if (5 < line->_M_string_length) {
      std::__cxx11::string::substr((ulong)local_48,(ulong)line);
      std::__cxx11::string::operator=((string *)&local_88,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
    }
  }
  else {
    std::__cxx11::string::_M_replace((ulong)&local_68,0,(char *)local_68._M_string_length,0x143d9d);
    std::__cxx11::string::_M_assign((string *)&local_88);
  }
  this_00 = (this->m_server).px;
  if (this_00 != (ServerConnection *)0x0) {
    ServerConnection::sendMessage(this_00,&local_68,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<ServerConnection>::operator->() const [T = ServerConnection]"
               );
}

Assistant:

void _parseLine( const string& line ){
        string command;
        string data = "";
        if( line[0] == '\\' ){
            command = line.substr( 1, 4 );
            if( line.length() > 5 ){
                data = line.substr( 6 );
            }
        }
        else {
            command = "chat";
            data = line;
        }
        m_server->sendMessage( command, data );
    }